

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O3

JL_STATUS FreeUnmarshalledList(JlMarshallElement *Description,void *ListPtr,size_t ListCount)

{
  JL_DATA_TYPE JVar1;
  size_t extraout_RAX;
  void **allocatedArrayPtr;
  size_t sVar2;
  char **stringPtr;
  undefined8 *Structure;
  void *pvVar3;
  
  sVar2 = Description->ArrayFieldSize;
  pvVar3 = ListPtr;
  if (sVar2 == 0) {
    pvVar3 = *ListPtr;
  }
  if (ListCount != 0) {
    JVar1 = Description->Type;
    sVar2 = 0;
    do {
      Structure = (undefined8 *)(Description->ArrayItemSize * sVar2 + (long)pvVar3);
      if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
        FreeUnmarshalledDictionary
                  (Description->ChildStructDescription,
                   (ulong)Description->ChildStructDescriptionCount,Structure);
      }
      else if ((JVar1 == JL_DATA_TYPE_STRING) && ((void *)*Structure != (void *)0x0)) {
        WjTestLib_Free((void *)*Structure);
        *Structure = 0;
      }
      sVar2 = sVar2 + 1;
    } while (ListCount != sVar2);
    sVar2 = Description->ArrayFieldSize;
  }
  if ((sVar2 == 0) && (*ListPtr != (void *)0x0)) {
    WjTestLib_Free(*ListPtr);
    *(undefined8 *)ListPtr = 0;
    sVar2 = extraout_RAX;
  }
  return (JL_STATUS)sVar2;
}

Assistant:

static
JL_STATUS
    FreeUnmarshalledList
    (
        JlMarshallElement const*    Description,
        void*                       ListPtr,
        size_t                      ListCount
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JL_DATA_TYPE type = Description->Type;
    void* array = NULL;

    if( 0 == Description->ArrayFieldSize )
    {
        // Then the array container was allocated, and ListPtr points to the array container.
        void** allocatedArrayPtr = ListPtr;
        array = *allocatedArrayPtr;
    }
    else
    {
        // Fixed array, so ListPtr is pointing to the start of the array in the struct
        array = ListPtr;
    }

    for( size_t i=0; i<ListCount; i++ )
    {
        void* itemPtr = ((uint8_t*)array) + ( Description->ArrayItemSize * i );
        if( JL_DATA_TYPE_STRING == type )
        {
            char** stringPtr = itemPtr;

            if( NULL != *stringPtr )
            {
                JlFree( *stringPtr );
                *stringPtr = NULL;
            }
        }
        if( JL_DATA_TYPE_DICTIONARY == type )
        {
            jlStatus = FreeUnmarshalledDictionary( Description->ChildStructDescription, Description->ChildStructDescriptionCount, itemPtr );
        }
    }

    if( 0 == Description->ArrayFieldSize )
    {
        // Deallocate the container
        void** allocatedArrayPtr = ListPtr;

        if( NULL != *allocatedArrayPtr )
        {
            JlFree( *allocatedArrayPtr );
            *allocatedArrayPtr = NULL;
        }
    }

    jlStatus = JL_STATUS_SUCCESS;

    return jlStatus;
}